

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptrlist.c
# Opt level: O1

void raviX_ptrlist_split_node(PtrList *head)

{
  C_MemoryAllocator *pCVar1;
  PtrList *pPVar2;
  PtrList *pPVar3;
  int iVar4;
  int iVar5;
  char cVar6;
  size_t __n;
  
  pCVar1 = head->allocator_;
  if (pCVar1 != (C_MemoryAllocator *)0x0) {
    iVar4 = (int)*(char *)head;
    pPVar3 = (PtrList *)(*pCVar1->calloc)(pCVar1->arena,1,0x58);
    pPVar2 = head->next_;
    pPVar3->allocator_ = pCVar1;
    iVar5 = iVar4 - iVar4 / 2;
    *(char *)head = (char)iVar5;
    pPVar3->next_ = pPVar2;
    pPVar2->prev_ = pPVar3;
    pPVar3->prev_ = head;
    head->next_ = pPVar3;
    cVar6 = (char)((uint)(iVar4 - (iVar4 >> 0x1f)) >> 1);
    *(char *)pPVar3 = cVar6;
    __n = (long)cVar6 << 3;
    memcpy(pPVar3->list_,head->list_ + iVar5,__n);
    memset(head->list_ + iVar5,0xf0,__n);
    return;
  }
  __assert_fail("alloc",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/ptrlist.c"
                ,0x1c,"void raviX_ptrlist_split_node(PtrList *)");
}

Assistant:

void raviX_ptrlist_split_node(PtrList *head)
{
	int old = head->nr_, nr = old / 2;
	C_MemoryAllocator *alloc = head->allocator_;
	assert(alloc);
	PtrList *newlist = (PtrList *)alloc->calloc(alloc->arena, 1, sizeof(PtrList));
	PtrList *next = head->next_;
	newlist->allocator_ = alloc;

	old -= nr;
	head->nr_ = old;
	newlist->next_ = next;
	next->prev_ = newlist;
	newlist->prev_ = head;
	head->next_ = newlist;
	newlist->nr_ = nr;
	memcpy(newlist->list_, head->list_ + old, nr * sizeof(void *));
	memset(head->list_ + old, 0xf0, nr * sizeof(void *));
}